

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_tag_t mpack_read_tag(mpack_reader_t *reader)

{
  mpack_error_t mVar1;
  size_t sVar2;
  mpack_tag_t mVar3;
  size_t count;
  mpack_tag_t tag;
  mpack_reader_t *reader_local;
  mpack_type_t local_10;
  
  tag._8_8_ = reader;
  mVar1 = mpack_reader_error(reader);
  if (mVar1 == mpack_ok) {
    mVar1 = mpack_reader_track_element((mpack_reader_t *)tag._8_8_);
    if (mVar1 == mpack_ok) {
      memset(&count,0,0x10);
      sVar2 = mpack_parse_tag((mpack_reader_t *)tag._8_8_,(mpack_tag_t *)&count);
      if (sVar2 == 0) {
        mVar3 = mpack_tag_nil();
        reader_local = (mpack_reader_t *)mVar3.v;
        local_10 = mVar3.type;
      }
      else {
        *(size_t *)(tag._8_8_ + 0x38) = sVar2 + *(long *)(tag._8_8_ + 0x38);
        reader_local = (mpack_reader_t *)count;
        local_10 = tag.v.l;
      }
    }
    else {
      mVar3 = mpack_tag_nil();
      reader_local = (mpack_reader_t *)mVar3.v;
      local_10 = mVar3.type;
    }
  }
  else {
    mVar3 = mpack_tag_nil();
    reader_local = (mpack_reader_t *)mVar3.v;
    local_10 = mVar3.type;
  }
  mVar3.type = local_10;
  mVar3.v = (anon_union_8_8_6320e492_for_v)reader_local;
  mVar3._12_4_ = 0;
  return mVar3;
}

Assistant:

mpack_tag_t mpack_read_tag(mpack_reader_t* reader) {
    mpack_log("reading tag\n");

    // make sure we can read a tag
    if (mpack_reader_error(reader) != mpack_ok)
        return mpack_tag_nil();
    if (mpack_reader_track_element(reader) != mpack_ok)
        return mpack_tag_nil();

    mpack_tag_t tag = MPACK_TAG_ZERO;
    size_t count = mpack_parse_tag(reader, &tag);
    if (count == 0)
        return mpack_tag_nil();

    #if MPACK_READ_TRACKING
    mpack_error_t track_error = mpack_ok;

    switch (tag.type) {
        case mpack_type_map:
        case mpack_type_array:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.l);
            break;
        case mpack_type_str:
        case mpack_type_bin:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.n);
            break;
        case mpack_type_ext:
            track_error = mpack_track_push(&reader->track, tag.type, tag.v.ext.length);
            break;
        default:
            break;
    }

    if (track_error != mpack_ok) {
        mpack_reader_flag_error(reader, track_error);
        return mpack_tag_nil();
    }
    #endif

    reader->data += count;
    return tag;
}